

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  char **in_RSI;
  int in_EDI;
  int nfail;
  int c;
  undefined4 in_stack_00000024;
  uint local_18;
  
  while( true ) {
    iVar2 = getopt(in_EDI,in_RSI,"h");
    if (iVar2 == -1) {
      printf("Running: test_el_access()\n");
      _Var1 = test_el_access();
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test test_el_access())\n");
      }
      local_18 = (uint)!_Var1;
      printf("Running: run_mat_pair_test(mptest_el_access2)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_el_access2))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_testfuncs)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_testfuncs))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_swap_rows)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_swap_rows))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_clear_row)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_clear_row))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_multadd_row)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_multadd_row))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_multadd_row_from)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_multadd_row_from))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_copy_row)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_copy_row))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_row_iszero)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_row_iszero))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_swap_cols)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_swap_cols))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_mult_col_from)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_mult_col_from))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_copy_col)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_copy_col))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_iszero)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_iszero))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_clear)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_clear))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: test_copy()\n");
      _Var1 = test_copy();
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test test_copy())\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_permute_rows)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_permute_rows))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: run_mat_pair_test(mptest_permute_cols)\n");
      _Var1 = run_mat_pair_test((mat_pair_test)CONCAT44(in_stack_00000024,argc));
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test run_mat_pair_test(mptest_permute_cols))\n");
        local_18 = local_18 + 1;
      }
      printf("Running: test_add()\n");
      _Var1 = test_add();
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test test_add())\n");
        local_18 = local_18 + 1;
      }
      printf("Running: test_add_inplace()\n");
      _Var1 = test_add_inplace();
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test test_add_inplace())\n");
        local_18 = local_18 + 1;
      }
      printf("Running: test_mul()\n");
      _Var1 = test_mul();
      if (_Var1) {
        printf("--> pass\n");
      }
      else {
        printf("--> FAIL (test test_mul())\n");
        local_18 = local_18 + 1;
      }
      return (uint)(local_18 != 0);
    }
    if (iVar2 == 0x3f) break;
    if (iVar2 == 0x68) {
      usage();
      exit(0);
    }
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
	/* Read cmdline args */
	int c;
	while ((c = getopt(argc, argv, "h")) != -1) {
		switch(c) {
		case 'h':
			usage();
			exit(EXIT_SUCCESS);
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	int nfail = 0;
#define RUN_TEST(x) \
	do { \
		printf("Running: " #x "\n"); \
		if (!x) { \
			printf("--> FAIL (test " #x ")\n"); \
			++nfail; \
		} else { \
			printf("--> pass\n"); \
		} \
	} while(0)

	// Tests for the elementary ops on submatrices
	RUN_TEST(test_el_access());
	RUN_TEST(run_mat_pair_test(mptest_el_access2));
	RUN_TEST(run_mat_pair_test(mptest_testfuncs));
	RUN_TEST(run_mat_pair_test(mptest_swap_rows));
	RUN_TEST(run_mat_pair_test(mptest_clear_row));
	RUN_TEST(run_mat_pair_test(mptest_multadd_row));
	RUN_TEST(run_mat_pair_test(mptest_multadd_row_from));
	RUN_TEST(run_mat_pair_test(mptest_copy_row));
	RUN_TEST(run_mat_pair_test(mptest_row_iszero));
	RUN_TEST(run_mat_pair_test(mptest_swap_cols));
	RUN_TEST(run_mat_pair_test(mptest_mult_col_from));
	RUN_TEST(run_mat_pair_test(mptest_copy_col));

	// Tests for the entire matrix
	RUN_TEST(run_mat_pair_test(mptest_iszero));
	RUN_TEST(run_mat_pair_test(mptest_clear));
	RUN_TEST(test_copy());
	RUN_TEST(run_mat_pair_test(mptest_permute_rows));
	RUN_TEST(run_mat_pair_test(mptest_permute_cols));
	RUN_TEST(test_add());
	RUN_TEST(test_add_inplace());
	RUN_TEST(test_mul());
#undef RUN_TEST

	return (nfail == 0 ? EXIT_SUCCESS : EXIT_FAILURE);
}